

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_layout_widget_space(nk_rect *bounds,nk_context *ctx,nk_window *win,int modify)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  nk_panel_type type;
  int iVar8;
  nk_panel_row_layout_type nVar9;
  int iVar10;
  nk_panel *pnVar11;
  float *pfVar12;
  nk_vec2 nVar13;
  nk_vec2 nVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float local_68;
  
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x46f7,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  pnVar11 = ctx->current->layout;
  if (pnVar11 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x46f8,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  if (bounds == (nk_rect *)0x0) {
    __assert_fail("bounds",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x46ff,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  fVar18 = (ctx->style).window.spacing.x;
  fVar17 = (ctx->style).window.spacing.y;
  type = pnVar11->type;
  nVar13 = nk_panel_get_padding(&ctx->style,type);
  fVar16 = (pnVar11->bounds).w;
  iVar8 = (pnVar11->row).columns;
  nVar14 = nk_panel_get_padding(&ctx->style,type);
  iVar15 = 1;
  if (1 < iVar8) {
    iVar15 = iVar8;
  }
  nVar9 = (pnVar11->row).type;
  if (NK_LAYOUT_TEMPLATE < nVar9) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4764,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  fVar21 = (fVar16 - (nVar14.x + nVar14.x)) - (float)(iVar15 + -1) * fVar18;
  iVar15 = (int)win;
  switch(nVar9) {
  case NK_LAYOUT_DYNAMIC_FIXED:
    if (fVar21 <= 1.0) {
      fVar21 = 1.0;
    }
    fVar22 = (float)(pnVar11->row).index;
    fVar16 = (fVar21 / (float)iVar8) * fVar22;
    fVar19 = (fVar16 - (float)(int)fVar16) + fVar21 / (float)iVar8;
    break;
  case NK_LAYOUT_DYNAMIC_ROW:
    fVar1 = (pnVar11->row).item_width;
    fVar16 = (pnVar11->row).item_offset;
    fVar21 = fVar21 * fVar1;
    fVar19 = (fVar16 - (float)(int)fVar16) + fVar21;
    fVar22 = 0.0;
    if (iVar15 != 0) {
      (pnVar11->row).item_offset = fVar18 + fVar21 + fVar16;
      (pnVar11->row).filled = (pnVar11->row).filled + fVar1;
      (pnVar11->row).index = 0;
    }
    goto LAB_0013a931;
  case NK_LAYOUT_DYNAMIC_FREE:
    uVar2 = pnVar11->at_x;
    uVar5 = pnVar11->at_y;
    uVar3 = (pnVar11->row).item.x;
    uVar6 = (pnVar11->row).item.y;
    fVar18 = (pnVar11->row).height;
    auVar20._4_4_ = 0;
    auVar20._0_4_ = *pnVar11->offset_x;
    auVar20._8_4_ = *pnVar11->offset_y;
    auVar20._12_4_ = 0;
    fVar17 = ((float)uVar3 * fVar16 + (float)uVar2) -
             (float)(SUB168(auVar20 | _DAT_00151480,0) - (double)DAT_00151480);
    fVar21 = ((float)uVar6 * fVar18 + (float)uVar5) -
             (float)(SUB168(auVar20 | _DAT_00151480,8) - DAT_00151480._8_8_);
    bounds->x = fVar17;
    bounds->y = fVar21;
    uVar4 = (pnVar11->row).item.w;
    uVar7 = (pnVar11->row).item.h;
    bounds->w = (float)uVar4 * fVar16 + (fVar17 - (float)(int)fVar17);
    bounds->h = (float)uVar7 * fVar18 + (fVar21 - (float)(int)fVar21);
    return;
  case NK_LAYOUT_DYNAMIC:
    pfVar12 = (pnVar11->row).ratio;
    if (pfVar12 == (float *)0x0) {
      __assert_fail("layout->row.ratio",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x472a,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    iVar8 = (pnVar11->row).index;
    fVar1 = pfVar12[iVar8];
    if (fVar1 < 0.0) {
      fVar1 = (pnVar11->row).item_width;
    }
    fVar22 = fVar18 * (float)iVar8;
    fVar16 = (pnVar11->row).item_offset;
    fVar19 = (fVar16 - (float)(int)fVar16) + fVar21 * fVar1;
    if (iVar15 != 0) {
      (pnVar11->row).item_offset = fVar21 * fVar1 + fVar16;
      (pnVar11->row).filled = (pnVar11->row).filled + fVar1;
    }
    goto LAB_0013a931;
  case NK_LAYOUT_STATIC_FIXED:
    fVar19 = (pnVar11->row).item_width;
    fVar22 = (float)(pnVar11->row).index;
    fVar16 = fVar19 * fVar22;
    break;
  case NK_LAYOUT_STATIC_ROW:
    iVar8 = (pnVar11->row).index;
    fVar19 = (pnVar11->row).item_width;
    fVar16 = (pnVar11->row).item_offset;
    goto LAB_0013a839;
  case NK_LAYOUT_STATIC_FREE:
    fVar18 = (pnVar11->row).item.w;
    fVar17 = pnVar11->at_x + (pnVar11->row).item.x;
    bounds->w = fVar18;
    if ((iVar15 != 0) &&
       (fVar18 = fVar18 + fVar17, pnVar11->max_x <= fVar18 && fVar18 != pnVar11->max_x)) {
      pnVar11->max_x = fVar18;
    }
    bounds->x = fVar17 - (float)*pnVar11->offset_x;
    bounds->y = (pnVar11->at_y + (pnVar11->row).item.y) - (float)*pnVar11->offset_y;
    bounds->h = (pnVar11->row).item.h;
    return;
  case NK_LAYOUT_STATIC:
    iVar8 = (pnVar11->row).index;
    fVar19 = (pnVar11->row).ratio[iVar8];
    fVar16 = (pnVar11->row).item_offset;
LAB_0013a839:
    fVar22 = fVar18 * (float)iVar8;
    fVar21 = fVar19;
    if (iVar15 != 0) {
LAB_0013a920:
      (pnVar11->row).item_offset = fVar21 + fVar16;
    }
    goto LAB_0013a931;
  case NK_LAYOUT_TEMPLATE:
    iVar10 = (pnVar11->row).index;
    if (iVar8 <= iVar10) {
      __assert_fail("layout->row.index < layout->row.columns",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x475b,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    if (0xf < iVar10) {
      __assert_fail("layout->row.index < 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x475c,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    fVar16 = (pnVar11->row).item_offset;
    fVar21 = (pnVar11->row).templates[iVar10];
    fVar19 = (fVar16 - (float)(int)fVar16) + fVar21;
    fVar22 = fVar18 * (float)iVar10;
    if (iVar15 == 0) goto LAB_0013a931;
    goto LAB_0013a920;
  }
  fVar22 = fVar18 * fVar22;
LAB_0013a931:
  bounds->w = fVar19;
  bounds->h = (pnVar11->row).height - fVar17;
  bounds->y = pnVar11->at_y - (float)*pnVar11->offset_y;
  local_68 = nVar13.x;
  local_68 = fVar16 + pnVar11->at_x + fVar22 + local_68;
  if ((iVar15 != 0) &&
     (fVar19 = fVar19 + local_68, pnVar11->max_x <= fVar19 && fVar19 != pnVar11->max_x)) {
    pnVar11->max_x = fVar19;
  }
  bounds->x = local_68 - (float)*pnVar11->offset_x;
  return;
}

Assistant:

NK_LIB void
nk_layout_widget_space(struct nk_rect *bounds, const struct nk_context *ctx,
    struct nk_window *win, int modify)
{
    struct nk_panel *layout;
    const struct nk_style *style;

    struct nk_vec2 spacing;
    struct nk_vec2 padding;

    float item_offset = 0;
    float item_width = 0;
    float item_spacing = 0;
    float panel_space = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    NK_ASSERT(bounds);

    spacing = style->window.spacing;
    padding = nk_panel_get_padding(style, layout->type);
    panel_space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
                                            layout->bounds.w, layout->row.columns);

    #define NK_FRAC(x) (x - (int)x) /* will be used to remove fookin gaps */
    /* calculate the width of one item inside the current layout space */
    switch (layout->row.type) {
    case NK_LAYOUT_DYNAMIC_FIXED: {
        /* scaling fixed size widgets item width */
        float w = NK_MAX(1.0f,panel_space) / (float)layout->row.columns;
        item_offset = (float)layout->row.index * w;
        item_width = w + NK_FRAC(item_offset);
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_DYNAMIC_ROW: {
        /* scaling single ratio widget width */
        float w = layout->row.item_width * panel_space;
        item_offset = layout->row.item_offset;
        item_width = w + NK_FRAC(item_offset);
        item_spacing = 0;

        if (modify) {
            layout->row.item_offset += w + spacing.x;
            layout->row.filled += layout->row.item_width;
            layout->row.index = 0;
        }
    } break;
    case NK_LAYOUT_DYNAMIC_FREE: {
        /* panel width depended free widget placing */
        bounds->x = layout->at_x + (layout->bounds.w * layout->row.item.x);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + (layout->row.height * layout->row.item.y);
        bounds->y -= (float)*layout->offset_y;
        bounds->w = layout->bounds.w  * layout->row.item.w + NK_FRAC(bounds->x);
        bounds->h = layout->row.height * layout->row.item.h + NK_FRAC(bounds->y);
        return;
    }
    case NK_LAYOUT_DYNAMIC: {
        /* scaling arrays of panel width ratios for every widget */
        float ratio, w;
        NK_ASSERT(layout->row.ratio);
        ratio = (layout->row.ratio[layout->row.index] < 0) ?
            layout->row.item_width : layout->row.ratio[layout->row.index];

        w = (ratio * panel_space);
        item_spacing = (float)layout->row.index * spacing.x;
        item_offset = layout->row.item_offset;
        item_width = w + NK_FRAC(item_offset);

        if (modify) {
            layout->row.item_offset += w;
            layout->row.filled += ratio;
        }
    } break;
    case NK_LAYOUT_STATIC_FIXED: {
        /* non-scaling fixed widgets item width */
        item_width = layout->row.item_width;
        item_offset = (float)layout->row.index * item_width;
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_STATIC_ROW: {
        /* scaling single ratio widget width */
        item_width = layout->row.item_width;
        item_offset = layout->row.item_offset;
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_STATIC_FREE: {
        /* free widget placing */
        bounds->x = layout->at_x + layout->row.item.x;
        bounds->w = layout->row.item.w;
        if (((bounds->x + bounds->w) > layout->max_x) && modify)
            layout->max_x = (bounds->x + bounds->w);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + layout->row.item.y;
        bounds->y -= (float)*layout->offset_y;
        bounds->h = layout->row.item.h;
        return;
    }
    case NK_LAYOUT_STATIC: {
        /* non-scaling array of panel pixel width for every widget */
        item_spacing = (float)layout->row.index * spacing.x;
        item_width = layout->row.ratio[layout->row.index];
        item_offset = layout->row.item_offset;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_TEMPLATE: {
        /* stretchy row layout with combined dynamic/static widget width*/
        float w;
        NK_ASSERT(layout->row.index < layout->row.columns);
        NK_ASSERT(layout->row.index < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
        w = layout->row.templates[layout->row.index];
        item_offset = layout->row.item_offset;
        item_width = w + NK_FRAC(item_offset);
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += w;
    } break;
    #undef NK_FRAC
    default: NK_ASSERT(0); break;
    };

    /* set the bounds of the newly allocated widget */
    bounds->w = item_width;
    bounds->h = layout->row.height - spacing.y;
    bounds->y = layout->at_y - (float)*layout->offset_y;
    bounds->x = layout->at_x + item_offset + item_spacing + padding.x;
    if (((bounds->x + bounds->w) > layout->max_x) && modify)
        layout->max_x = bounds->x + bounds->w;
    bounds->x -= (float)*layout->offset_x;
}